

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
::destroy(AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
          *this)

{
  WeakFulfiller<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *this_00
  ;
  
  this_00 = (this->adapter).wrapper;
  if ((this_00->super_WeakFulfillerBase).inner == (PromiseRejector *)0x0) {
    AsyncObject::~AsyncObject((AsyncObject *)this_00);
    operator_delete(this_00,0x18);
  }
  else {
    (this_00->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  }
  ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
  ~ExceptionOr(&this->result);
  AsyncObject::~AsyncObject
            ((AsyncObject *)
             &this->
              super_PromiseFulfiller<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
            );
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }